

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflags.h
# Opt level: O1

void QWidgetPrivate::adjustFlags(WindowFlags *flags,QWidget *w)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = (flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).super_QFlagsStorage<Qt::WindowType>.
          i;
  uVar3 = uVar2 & 0xff;
  if (((w != (QWidget *)0x0) && (uVar3 == 0 || uVar3 == 0x12)) &&
     (*(long *)(*(long *)&w->field_0x8 + 0x10) == 0)) {
    (flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).super_QFlagsStorage<Qt::WindowType>.i =
         uVar2 | 1;
    uVar3 = 1;
  }
  uVar4 = (flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).super_QFlagsStorage<Qt::WindowType>.
          i;
  if ((uVar4 >> 0x19 & 1) == 0) {
    if ((uVar2 & 0xa01f800) != 0) {
      if ((uVar4 >> 0xb & 1) == 0) goto LAB_002f6a48;
      goto LAB_002f6a50;
    }
  }
  else {
    if ((uVar4 & 0x801c000) != 0) {
      uVar4 = uVar4 & 0xffffc7ff;
LAB_002f6a48:
      (flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).super_QFlagsStorage<Qt::WindowType>.i =
           uVar4 | 0x3000;
    }
LAB_002f6a50:
    if ((uVar2 & 0xa01f800) != 0) goto LAB_002f6a7b;
  }
  uVar2 = (flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).super_QFlagsStorage<Qt::WindowType>.
          i;
  (flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).super_QFlagsStorage<Qt::WindowType>.i =
       uVar2 | 0x8003000;
  if ((0xb < uVar3) || ((0x828U >> (uVar3 & 0x1f) & 1) == 0)) {
    (flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).super_QFlagsStorage<Qt::WindowType>.i =
         uVar2 | 0x8800f000;
  }
LAB_002f6a7b:
  if ((*(byte *)(*(long *)&w->field_0x8 + 0x242) & 8) != 0) {
    pbVar1 = (byte *)((long)&(flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).
                             super_QFlagsStorage<Qt::WindowType>.i + 2);
    *pbVar1 = *pbVar1 | 8;
  }
  return;
}

Assistant:

constexpr inline QFlags operator&(QFlags other) const noexcept { return QFlags(std::in_place, i & other.i); }